

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_palette.c
# Opt level: O1

bool_t prf_material_palette_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  bool bVar1;
  uint16_t uVar2;
  uint8_t *puVar3;
  uint uVar4;
  bool_t bVar5;
  float32_t *pfVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  float32_t fVar11;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_material_palette_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    if ((4 < uVar2) && (node->data == (uint8_t *)0x0)) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar3 = (uint8_t *)malloc((ulong)(uVar2 - 4));
      }
      else {
        puVar3 = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
      }
      node->data = puVar3;
      if (puVar3 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar4 = 4;
        goto LAB_001081a1;
      }
    }
    iVar9 = 4;
    do {
      iVar7 = iVar9 + 4;
      if ((int)(uint)node->length < iVar7) {
        bVar1 = false;
      }
      else {
        pfVar6 = (float32_t *)(node->data + iVar9);
        fVar11 = bf_get_float32_be(bfile);
        pfVar6[-1] = fVar11;
        iVar10 = iVar9 + 8;
        if (iVar10 <= (int)(uint)node->length) {
          fVar11 = bf_get_float32_be(bfile);
          *pfVar6 = fVar11;
          iVar7 = iVar9 + 0xc;
          if ((int)(uint)node->length < iVar7) {
LAB_00108225:
            bVar1 = false;
            iVar9 = iVar10;
            goto LAB_0010822a;
          }
          fVar11 = bf_get_float32_be(bfile);
          pfVar6[1] = fVar11;
          iVar10 = iVar9 + 0x10;
          if (iVar10 <= (int)(uint)node->length) {
            fVar11 = bf_get_float32_be(bfile);
            pfVar6[2] = fVar11;
            iVar7 = iVar9 + 0x14;
            if ((int)(uint)node->length < iVar7) goto LAB_00108225;
            fVar11 = bf_get_float32_be(bfile);
            pfVar6[3] = fVar11;
            iVar10 = iVar9 + 0x18;
            if (iVar10 <= (int)(uint)node->length) {
              fVar11 = bf_get_float32_be(bfile);
              pfVar6[4] = fVar11;
              iVar7 = iVar9 + 0x1c;
              if ((int)(uint)node->length < iVar7) goto LAB_00108225;
              fVar11 = bf_get_float32_be(bfile);
              pfVar6[5] = fVar11;
              iVar10 = iVar9 + 0x20;
              if (iVar10 <= (int)(uint)node->length) {
                fVar11 = bf_get_float32_be(bfile);
                pfVar6[6] = fVar11;
                iVar7 = iVar9 + 0x24;
                if ((int)(uint)node->length < iVar7) goto LAB_00108225;
                fVar11 = bf_get_float32_be(bfile);
                pfVar6[7] = fVar11;
                iVar10 = iVar9 + 0x28;
                if (iVar10 <= (int)(uint)node->length) {
                  fVar11 = bf_get_float32_be(bfile);
                  pfVar6[8] = fVar11;
                  iVar7 = iVar9 + 0x2c;
                  if ((int)(uint)node->length < iVar7) goto LAB_00108225;
                  fVar11 = bf_get_float32_be(bfile);
                  pfVar6[9] = fVar11;
                  iVar10 = iVar9 + 0x30;
                  if (iVar10 <= (int)(uint)node->length) {
                    fVar11 = bf_get_float32_be(bfile);
                    pfVar6[10] = fVar11;
                    iVar7 = iVar9 + 0x34;
                    if ((int)(uint)node->length < iVar7) goto LAB_00108225;
                    fVar11 = bf_get_float32_be(bfile);
                    pfVar6[0xb] = fVar11;
                    iVar10 = iVar9 + 0x38;
                    if (iVar10 <= (int)(uint)node->length) {
                      fVar11 = bf_get_float32_be(bfile);
                      pfVar6[0xc] = fVar11;
                      iVar7 = iVar9 + 0x3c;
                      if ((int)(uint)node->length < iVar7) goto LAB_00108225;
                      fVar11 = (float32_t)bf_get_uint32_be(bfile);
                      pfVar6[0xd] = fVar11;
                      if (iVar9 + 0x48 <= (int)(uint)node->length) {
                        bf_read(bfile,(uint8_t *)(pfVar6 + 0xe),0xc);
                        iVar10 = iVar9 + 0xb8;
                        lVar8 = 0;
                        iVar7 = iVar9 + 0x48;
                        do {
                          bVar1 = true;
                          iVar9 = iVar7;
                          if ((int)(uint)node->length < iVar7 + 4) break;
                          fVar11 = (float32_t)bf_get_uint32_be(bfile);
                          pfVar6[lVar8 + 0x11] = fVar11;
                          lVar8 = lVar8 + 1;
                          iVar9 = iVar10;
                          iVar7 = iVar7 + 4;
                        } while (lVar8 != 0x1c);
                        goto LAB_0010822a;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        bVar1 = false;
        iVar9 = iVar7;
      }
LAB_0010822a:
    } while (bVar1);
    bVar5 = 1;
    uVar4 = (uint)node->length - iVar9;
    if (uVar4 != 0 && iVar9 <= (int)(uint)node->length) {
      bf_read(bfile,node->data + (long)iVar9 + -4,uVar4);
    }
  }
  else {
    prf_error(9,"tried material palette load method for node of type %d.",(ulong)uVar2);
    uVar4 = 2;
LAB_001081a1:
    bVar5 = 0;
    bf_rewind(bfile,uVar4);
  }
  return bVar5;
}

Assistant:

static
bool_t
prf_material_palette_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos, count;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_material_palette_info.opcode ) {
        prf_error( 9, "tried material palette load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->length > 4 && node->data == NULL ) { /* node preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    count = 0;
    do {
        int i;
        node_data * data;
        data = (node_data *) (node->data + pos - 4);

        if ( node->length < (pos + 4) ) break;
        data->ambient_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->diffuse_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->specular_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->emissive_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->shininess = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->alpha = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;

        if ( node->length < (pos + 12) ) break;
        bf_read( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        for ( i = 0; i < 28 && node->length >= (pos + 4); i++ ) {
            data->reserved1[i] = bf_get_uint32_be( bfile ); pos += 4;
        }
        count++;
    } while ( TRUE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4, node->length - pos );

    return TRUE;
}